

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cecPat.c
# Opt level: O1

void Cec_ManPatComputePattern4_rec(Gia_Man_t *p,Gia_Obj_t *pObj)

{
  Gia_Obj_t *pGVar1;
  ulong uVar2;
  uint uVar3;
  int iVar4;
  
  while( true ) {
    pGVar1 = p->pObjs;
    if ((pObj < pGVar1) || (pGVar1 + p->nObjs <= pObj)) {
      __assert_fail("p->pObjs <= pObj && pObj < p->pObjs + p->nObjs",
                    "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/gia/gia.h"
                    ,0x1b7,"int Gia_ObjId(Gia_Man_t *, Gia_Obj_t *)");
    }
    iVar4 = (int)((long)pObj - (long)pGVar1 >> 2) * -0x55555555;
    if (p->nTravIdsAlloc <= iVar4) {
      __assert_fail("Gia_ObjId(p, pObj) < p->nTravIdsAlloc",
                    "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/gia/gia.h"
                    ,0x23c,"int Gia_ObjIsTravIdCurrent(Gia_Man_t *, Gia_Obj_t *)");
    }
    if (p->pTravIds[iVar4] == p->nTravIds) break;
    p->pTravIds[iVar4] = p->nTravIds;
    uVar2 = *(ulong *)pObj;
    *(ulong *)pObj = uVar2 & 0xffffffffbfffffff;
    uVar3 = (uint)uVar2;
    if ((~uVar3 & 0x9fffffff) == 0) {
      return;
    }
    if (((int)uVar3 < 0) || ((uVar3 & 0x1fffffff) == 0x1fffffff)) {
      __assert_fail("Gia_ObjIsAnd(pObj)",
                    "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/proof/cec/cecPat.c"
                    ,0x145,"void Cec_ManPatComputePattern4_rec(Gia_Man_t *, Gia_Obj_t *)");
    }
    Cec_ManPatComputePattern4_rec(p,pObj + -(ulong)(uVar3 & 0x1fffffff));
    pObj = pObj + -(ulong)(*(uint *)&pObj->field_0x4 & 0x1fffffff);
  }
  return;
}

Assistant:

void Cec_ManPatComputePattern4_rec( Gia_Man_t * p, Gia_Obj_t * pObj )
{
    if ( Gia_ObjIsTravIdCurrent(p, pObj) )
        return;
    Gia_ObjSetTravIdCurrent(p, pObj);
    pObj->fMark0 = 0;
    if ( Gia_ObjIsCi(pObj) )
        return;
    assert( Gia_ObjIsAnd(pObj) );
    Cec_ManPatComputePattern4_rec( p, Gia_ObjFanin0(pObj) );
    Cec_ManPatComputePattern4_rec( p, Gia_ObjFanin1(pObj) );
}